

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Gym_File::track_info_(Gym_File *this,track_info_t *out,int param_2)

{
  byte bVar1;
  char *pcVar2;
  long length;
  
  pcVar2 = ((header_t *)this->file_begin)->tag + this->data_offset;
  length = 0;
  while (pcVar2 < this->file_end) {
    bVar1 = *pcVar2;
    if (bVar1 - 1 < 2) {
      pcVar2 = pcVar2 + 3;
    }
    else if (bVar1 == 3) {
      pcVar2 = pcVar2 + 2;
    }
    else {
      pcVar2 = pcVar2 + 1;
      if (bVar1 == 0) {
        length = length + 1;
      }
    }
  }
  get_gym_info((header_t *)this->file_begin,length,out);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t track_info_( track_info_t* out, int ) const
	{
		long length = gym_track_length( &file_begin [data_offset], file_end );
		get_gym_info( *(Gym_Emu::header_t const*) file_begin, length, out );
		return 0;
	}